

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mchain_details.hpp
# Opt level: O1

string * __thiscall
so_5::mchain_props::
mchain_template<so_5::mchain_props::details::limited_preallocated_demand_queue,so_5::impl::msg_tracing_helpers::mchain_tracing_disabled_base>
::query_name_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  ostream *poVar1;
  ostringstream s;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"<mchain:id=",0xb);
  poVar1 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)local_190);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,">",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string
		query_name() const override
			{
				std::ostringstream s;
				s << "<mchain:id=" << m_id << ">";

				return s.str();
			}